

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O1

Relations dg::vr::compose(Relations *lt,Relations *rt)

{
  Type fst;
  bitset<12UL> bVar1;
  ulong uVar2;
  bool bVar3;
  Type TVar4;
  Relations RVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  Relations result;
  _Base_bitset<1UL> local_50;
  Relations *local_48;
  long local_40;
  ulong local_38;
  
  bVar1.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(lt->bits).super__Base_bitset<1UL>._M_w;
  local_50._M_w = (rt->bits).super__Base_bitset<1UL>._M_w;
  if ((((ulong)bVar1.super__Base_bitset<1UL>._M_w & 1) == 0) &&
     (uVar2 = local_50._M_w & 1, local_50._M_w = (_WordT)bVar1.super__Base_bitset<1UL>._M_w,
     uVar2 == 0)) {
    local_50._M_w = 0;
    lVar8 = 0;
    local_48 = lt;
    do {
      fst = *(Type *)((long)&Relations::all + lVar8);
      local_40 = lVar8;
      if (((local_48->bits).super__Base_bitset<1UL>._M_w >> ((ulong)fst & 0x3f) & 1) != 0) {
        local_38 = 1L << ((byte)fst & 0x3f);
        lVar8 = 0;
        do {
          TVar4 = *(Type *)((long)&Relations::all + lVar8);
          if ((((rt->bits).super__Base_bitset<1UL>._M_w >> ((ulong)TVar4 & 0x3f) & 1) != 0) &&
             (bVar3 = Relations::transitiveOver(fst,TVar4), bVar3)) {
            if ((((uint)(1L << ((byte)TVar4 & 0x3f)) | (uint)(1L << ((byte)fst & 0x3f))) & 0x2a8) ==
                0) {
              if (PF < fst) {
                pcVar7 = "%s: __position (which is %zu) >= _Nb (which is %zu)";
                uVar6 = 0x102164;
                std::__throw_out_of_range_fmt
                          ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                           (ulong)fst,0xc);
                if (0xb < (uint)pcVar7) {
                  abort();
                }
                switch((ulong)pcVar7 & 0xffffffff) {
                default:
                  return (Relations)0;
                case 2:
                case 3:
                  bVar3 = (uVar6 & 0xfffffffe) == 2;
                  break;
                case 4:
                case 5:
                  bVar3 = (uVar6 & 0xfffffffe) == 4;
                  break;
                case 6:
                case 7:
                  bVar3 = (uVar6 & 0xfffffffe) == 6;
                  break;
                case 8:
                case 9:
                  bVar3 = (uVar6 & 0xfffffffe) == 8;
                }
                RVar5.bits.super__Base_bitset<1UL>._M_w._1_7_ =
                     (undefined7)
                     ((ulong)((long)&switchD_001014b9::switchdataD_00102000 +
                             (long)(int)(&switchD_001014b9::switchdataD_00102000)
                                        [(ulong)pcVar7 & 0xffffffff]) >> 8);
                RVar5.bits.super__Base_bitset<1UL>._M_w._0_1_ = bVar3;
                return (Relations)RVar5.bits.super__Base_bitset<1UL>._M_w;
              }
              local_50._M_w = local_50._M_w | local_38;
            }
            else {
              TVar4 = Relations::getStrict(fst);
              local_50._M_w = local_50._M_w | 1L << ((byte)TVar4 & 0x3f);
            }
          }
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0x30);
      }
      lVar8 = local_40 + 4;
    } while (lVar8 != 0x30);
    Relations::addImplied((Relations *)&local_50);
  }
  return (Relations)local_50._M_w;
}

Assistant:

Relations compose(const Relations &lt, const Relations &rt) {
    if (lt.has(Relations::EQ))
        return rt;
    if (rt.has(Relations::EQ))
        return lt;
    Relations result;
    for (Relations::Type ltRel : Relations::all) {
        if (!lt.has(ltRel))
            continue;

        for (Relations::Type rtRel : Relations::all) {
            if (rt.has(rtRel) && Relations::transitiveOver(ltRel, rtRel)) {
                if (Relations::isStrict(ltRel) || Relations::isStrict(rtRel))
                    result.set(Relations::getStrict(ltRel));
                else
                    result.set(ltRel);
            }
        }
    }
    return result.addImplied();
}